

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O0

tuple<int,_int>
find_i_jNANS(vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *buff)

{
  int iVar1;
  reference pvVar2;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var3;
  size_type sVar4;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var5;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *in_RSI;
  int local_30;
  int i_1;
  __tuple_element_t<1UL,_tuple<int,_int>_> w;
  int i;
  __tuple_element_t<0UL,_tuple<int,_int>_> p;
  int tmp2;
  int tmp;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *buff_local;
  
  _tmp2 = in_RSI;
  buff_local = buff;
  pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                     (in_RSI,0);
  p_Var3 = std::get<0ul,int,int>(pvVar2);
  iVar1 = *p_Var3;
  sVar4 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::size(_tmp2);
  if (1 < sVar4) {
    pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                       (_tmp2,1);
    p_Var3 = std::get<0ul,int,int>(pvVar2);
    p = iVar1;
    if (iVar1 == *p_Var3) {
      pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                         (_tmp2,2);
      p_Var3 = std::get<0ul,int,int>(pvVar2);
      p = *p_Var3;
    }
  }
  pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                     (_tmp2,0);
  p_Var5 = std::get<1ul,int,int>(pvVar2);
  iVar1 = *p_Var5;
  local_30 = 1;
  do {
    sVar4 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::size(_tmp2);
    if (sVar4 <= (ulong)(long)local_30) {
LAB_001035a2:
      std::make_tuple<int&,int&>((int *)buff,&p);
      return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)buff;
    }
    pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                       (_tmp2,(long)local_30);
    p_Var5 = std::get<1ul,int,int>(pvVar2);
    if (iVar1 == *p_Var5) {
      pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                         (_tmp2,(long)(local_30 + 1));
      std::get<1ul,int,int>(pvVar2);
      goto LAB_001035a2;
    }
    pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                       (_tmp2,(long)(local_30 + 1));
    p_Var5 = std::get<1ul,int,int>(pvVar2);
    if (iVar1 == *p_Var5) {
      pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                         (_tmp2,(long)local_30);
      std::get<1ul,int,int>(pvVar2);
      goto LAB_001035a2;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

std::tuple<int,int> find_i_jNANS (std::vector<std::tuple<int,int>> &buff){
    int tmp,tmp2;
    auto p = std::get<0>(buff[0]);
    for(int i = 1; i<buff.size(); i++){
        if(p==std::get<0>(buff[i])){
            tmp = std::get<0>(buff[i+1]);
            break;
        }
        else if(i){tmp = p; break;}
    }

    auto w = std::get<1>(buff[0]);
    for(int i = 1; i<buff.size(); i++){
        if(w==std::get<1>(buff[i])){
            tmp2 = std::get<1>(buff[i+1]);
            break;
        }
        else if(w==std::get<1>(buff[i+1])){
            tmp2 = std::get<1>(buff[i]);
            break;
        }
        else {tmp2 = w;}
    }
    return std::make_tuple(tmp,tmp2);
}